

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

cmFortranSourceInfo * __thiscall
cmDependsFortranInternals::CreateObjectInfo(cmDependsFortranInternals *this,char *obj,char *src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>,_bool>
  pVar5;
  value_type entry;
  char *local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
  local_1a8;
  cmFortranSourceInfo local_d8;
  
  local_1b0 = obj;
  std::__cxx11::string::string((string *)&local_1a8,obj,(allocator *)&local_d8);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
          ::find(&(this->ObjectInfo)._M_t,&local_1a8.first);
  paVar1 = &local_1a8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8.first._M_dataplus._M_p,
                    local_1a8.first.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(this->ObjectInfo)._M_t._M_impl.super__Rb_tree_header) {
    paVar2 = &local_d8.Source.field_2;
    local_d8.Provides._M_t._M_impl._0_8_ = 0;
    local_d8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d8.Requires._M_t._M_impl._0_8_ = 0;
    local_d8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8.Requires._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d8.Includes._M_t._M_impl._0_8_ = 0;
    local_d8.Source.field_2._M_allocated_capacity = 0;
    local_d8.Source.field_2._8_8_ = 0;
    local_d8.Source._M_string_length = 0;
    local_d8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8.Provides._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_d8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8.Requires._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_d8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_d8.Includes._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_d8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_d8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_d8.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_d8.Source._M_dataplus._M_p = (pointer)paVar2;
    local_d8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_d8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_d8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_d8.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
    ::pair<const_char_*&,_cmFortranSourceInfo,_true>(&local_1a8,&local_1b0,&local_d8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_d8.Includes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_d8.Requires._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_d8.Provides._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.Source._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8.Source._M_dataplus._M_p,
                      local_d8.Source.field_2._M_allocated_capacity + 1);
    }
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
                        *)&this->ObjectInfo,&local_1a8);
    iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
    p_Var3 = iVar4._M_node[2]._M_parent;
    strlen(src);
    std::__cxx11::string::_M_replace((ulong)(iVar4._M_node + 2),0,(char *)p_Var3,(ulong)src);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1a8.second.Includes._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1a8.second.Requires._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1a8.second.Provides._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.second.Source._M_dataplus._M_p != &local_1a8.second.Source.field_2) {
      operator_delete(local_1a8.second.Source._M_dataplus._M_p,
                      local_1a8.second.Source.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8.first._M_dataplus._M_p,
                      local_1a8.first.field_2._M_allocated_capacity + 1);
    }
  }
  return (cmFortranSourceInfo *)(iVar4._M_node + 2);
}

Assistant:

cmFortranSourceInfo& CreateObjectInfo(const char* obj, const char* src)
  {
    std::map<std::string, cmFortranSourceInfo>::iterator i =
      this->ObjectInfo.find(obj);
    if (i == this->ObjectInfo.end()) {
      std::map<std::string, cmFortranSourceInfo>::value_type entry(
        obj, cmFortranSourceInfo());
      i = this->ObjectInfo.insert(entry).first;
      i->second.Source = src;
    }
    return i->second;
  }